

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O1

int8_t __thiscall
icu_63::UnicodeString::doCompare
          (UnicodeString *this,int32_t start,int32_t length,UChar *srcChars,int32_t srcStart,
          int32_t srcLength)

{
  UChar *pUVar1;
  ushort uVar2;
  ushort uVar3;
  byte bVar4;
  ulong uVar5;
  char16_t *pcVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  
  uVar2 = (this->fUnion).fStackFields.fLengthAndFlags;
  bVar4 = 0xff;
  if ((uVar2 & 1) == 0) {
    if ((short)uVar2 < 0) {
      iVar9 = (this->fUnion).fFields.fLength;
    }
    else {
      iVar9 = (int)(short)uVar2 >> 5;
    }
    iVar10 = start;
    if (iVar9 < start) {
      iVar10 = iVar9;
    }
    if (start < 0) {
      iVar10 = 0;
    }
    iVar7 = iVar9 - iVar10;
    if (length <= iVar9 - iVar10) {
      iVar7 = length;
    }
    if (length < 0) {
      iVar7 = 0;
    }
    if (srcChars == (UChar *)0x0) {
      bVar4 = iVar7 != 0;
    }
    else {
      if ((uVar2 & 2) == 0) {
        pcVar6 = (this->fUnion).fFields.fArray;
      }
      else {
        pcVar6 = (char16_t *)((long)&this->fUnion + 2);
      }
      pUVar1 = srcChars + srcStart;
      if (srcLength < 0) {
        srcLength = u_strlen_63(pUVar1 + srcStart);
      }
      bVar4 = -(iVar7 < srcLength) | 1;
      iVar9 = srcLength;
      if (iVar7 < srcLength) {
        iVar9 = iVar7;
      }
      if (iVar7 == srcLength) {
        bVar4 = 0;
      }
      if (0 < iVar9) {
        uVar5 = (ulong)iVar10;
        if (pcVar6 + uVar5 != pUVar1) {
          iVar9 = iVar9 + 1;
          lVar8 = 0;
          do {
            uVar2 = *(ushort *)((long)(pcVar6 + uVar5) + lVar8);
            uVar3 = *(ushort *)((long)pUVar1 + lVar8);
            if (uVar2 != uVar3) {
              uVar5 = (ulong)(byte)((byte)((uint)uVar2 - (uint)uVar3 >> 0xf) | 1);
              break;
            }
            lVar8 = lVar8 + 2;
            iVar9 = iVar9 + -1;
          } while (1 < iVar9);
          if (uVar2 != uVar3) {
            return (int8_t)uVar5;
          }
        }
      }
    }
  }
  return bVar4;
}

Assistant:

int8_t
UnicodeString::doCompare( int32_t start,
              int32_t length,
              const UChar *srcChars,
              int32_t srcStart,
              int32_t srcLength) const
{
  // compare illegal string values
  if(isBogus()) {
    return -1;
  }
  
  // pin indices to legal values
  pinIndices(start, length);

  if(srcChars == NULL) {
    // treat const UChar *srcChars==NULL as an empty string
    return length == 0 ? 0 : 1;
  }

  // get the correct pointer
  const UChar *chars = getArrayStart();

  chars += start;
  srcChars += srcStart;

  int32_t minLength;
  int8_t lengthResult;

  // get the srcLength if necessary
  if(srcLength < 0) {
    srcLength = u_strlen(srcChars + srcStart);
  }

  // are we comparing different lengths?
  if(length != srcLength) {
    if(length < srcLength) {
      minLength = length;
      lengthResult = -1;
    } else {
      minLength = srcLength;
      lengthResult = 1;
    }
  } else {
    minLength = length;
    lengthResult = 0;
  }

  /*
   * note that uprv_memcmp() returns an int but we return an int8_t;
   * we need to take care not to truncate the result -
   * one way to do this is to right-shift the value to
   * move the sign bit into the lower 8 bits and making sure that this
   * does not become 0 itself
   */

  if(minLength > 0 && chars != srcChars) {
    int32_t result;

#   if U_IS_BIG_ENDIAN 
      // big-endian: byte comparison works
      result = uprv_memcmp(chars, srcChars, minLength * sizeof(UChar));
      if(result != 0) {
        return (int8_t)(result >> 15 | 1);
      }
#   else
      // little-endian: compare UChar units
      do {
        result = ((int32_t)*(chars++) - (int32_t)*(srcChars++));
        if(result != 0) {
          return (int8_t)(result >> 15 | 1);
        }
      } while(--minLength > 0);
#   endif
  }
  return lengthResult;
}